

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_tools.cc
# Opt level: O0

void SamplePuzzles(int64_t limit)

{
  bool bVar1;
  long in_RDI;
  double weight;
  char c;
  char *__end3;
  char *__begin3;
  char (*__range3) [81];
  int num_clues;
  size_t grid_id;
  char grid [81];
  void *index;
  void *table;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_ffffffffffffff48;
  uniform_int_distribution<unsigned_long> *in_stack_ffffffffffffff50;
  undefined1 *local_98;
  undefined1 local_78 [64];
  char *in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  long local_8;
  
  MMapFile(in_stack_ffffffffffffffe0);
  MMapFile(in_stack_ffffffffffffffe0);
  local_8 = in_RDI;
  while (local_8 != 0) {
    std::uniform_int_distribution<unsigned_long>::operator()
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    GetGrid((size_t)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
            in_stack_ffffffffffffffc8);
    bVar1 = TdokuMinimize(SUB81((ulong)in_stack_ffffffffffffff50 >> 0x38,0),
                          SUB81((ulong)in_stack_ffffffffffffff50 >> 0x30,0),
                          (char *)in_stack_ffffffffffffff48);
    if (bVar1) {
      for (local_98 = local_78; local_98 != &stack0xffffffffffffffd9; local_98 = local_98 + 1) {
      }
      in_stack_ffffffffffffff50 =
           (uniform_int_distribution<unsigned_long> *)
           SamplingWeight((int)((ulong)&stack0xffffffffffffffd9 >> 0x20));
      printf("%.81s\t%f\n",in_stack_ffffffffffffff50,local_78);
      local_8 = local_8 + -1;
    }
  }
  return;
}

Assistant:

void SamplePuzzles(int64_t limit) {
    void *table = MMapFile("grid.counts");
    void *index = MMapFile("grid.index");

    char grid[81];
    while (limit != 0) {
        size_t grid_id = random_uint(rng) % num_equivalence_classes;
        GetGrid(grid_id, index, table, grid);
        if (TdokuMinimize(false, true, grid)) {
            int num_clues = 0;
            for (char c : grid) num_clues += (c != '.');
            double weight = SamplingWeight(num_clues);
            printf("%.81s\t%f\n", grid, weight);
            limit--;
        }
    }
}